

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLhandler.c
# Opt level: O0

void RDL_combinePathsToCycle
               (uchar *compressed_cycle,RDL_pathIterator *it1,RDL_pathIterator *it2,RDL_cfam *cfam)

{
  uint uVar1;
  RDL_cfam *cfam_local;
  RDL_pathIterator *it2_local;
  RDL_pathIterator *it1_local;
  uchar *compressed_cycle_local;
  
  memcpy(compressed_cycle,it1->compressed_path,(ulong)it1->compressed_number);
  RDL_bitset_or_inplace(compressed_cycle,it2->compressed_path,it2->compressed_number);
  if (it1->mode == 'a') {
    if (cfam->x != 0xffffffff) {
      RDL_bitset_set(compressed_cycle,cfam->x);
    }
  }
  else if (cfam->x == 0xffffffff) {
    uVar1 = RDL_edgeId(it1->gra,cfam->p,cfam->q);
    RDL_bitset_set(compressed_cycle,uVar1);
  }
  else {
    uVar1 = RDL_edgeId(it1->gra,cfam->p,cfam->x);
    RDL_bitset_set(compressed_cycle,uVar1);
    uVar1 = RDL_edgeId(it1->gra,cfam->q,cfam->x);
    RDL_bitset_set(compressed_cycle,uVar1);
  }
  return;
}

Assistant:

static void RDL_combinePathsToCycle(unsigned char* compressed_cycle, const RDL_pathIterator *it1,
    const RDL_pathIterator *it2, const RDL_cfam* cfam)
{
  memcpy(compressed_cycle, it1->compressed_path,
      it1->compressed_number * sizeof(*compressed_cycle));
  RDL_bitset_or_inplace(compressed_cycle, it2->compressed_path,
      it2->compressed_number);
  if(it1->mode == 'a') {
    /*even cycle*/
    if(cfam->x < UINT_MAX) {
      RDL_bitset_set(compressed_cycle, cfam->x);
    }
  }
  else {
    if(cfam->x < UINT_MAX) {
      /*even cycle*/
      RDL_bitset_set(compressed_cycle, RDL_edgeId(it1->gra,cfam->p,cfam->x));
      RDL_bitset_set(compressed_cycle, RDL_edgeId(it1->gra,cfam->q,cfam->x));
    }
    else {
      /*odd cycle*/
      RDL_bitset_set(compressed_cycle, RDL_edgeId(it1->gra,cfam->p,cfam->q));
    }
  }
}